

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall t_netstd_generator::generate_service(t_netstd_generator *this,t_service *tservice)

{
  char *pcVar1;
  ostream *poVar2;
  int __oflag;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  undefined1 local_230 [8];
  ofstream_with_content_based_conditional_update f_service;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string f_service_name;
  int ic;
  t_service *tservice_local;
  t_netstd_generator *this_local;
  
  f_service_name.field_2._12_4_ = t_generator::indent_count((t_generator *)this);
  std::operator+(&local_80,&this->namespace_dir_,"/");
  std::operator+(&local_60,&local_80,&(this->super_t_oop_generator).super_t_generator.service_name_)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,".cs");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,pcVar1,&local_251);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230,(char *)local_250,__oflag);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  reset_indent(this);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_278);
  poVar2 = std::operator<<((ostream *)local_230,local_278);
  netstd_type_usings_abi_cxx11_(&local_298,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_298);
  netstd_thrift_usings_abi_cxx11_(&local_2b8,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_2b8);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string(local_278);
  start_netstd_namespace(this,(ostream *)local_230);
  t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)local_230,(string *)&local_2d8);
  poVar2 = std::operator<<(poVar2,"public partial class ");
  std::__cxx11::string::string
            ((string *)&local_318,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  normalize_name(&local_2f8,this,&local_318,false);
  poVar2 = std::operator<<(poVar2,(string *)&local_2f8);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_338);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2d8);
  t_generator::indent_up((t_generator *)this);
  generate_service_interface(this,(ostream *)local_230,tservice);
  generate_service_client(this,(ostream *)local_230,tservice);
  generate_service_server(this,(ostream *)local_230,tservice);
  generate_service_helpers(this,(ostream *)local_230,tservice);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_358,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)local_230,(string *)&local_358);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_358);
  poVar2 = (ostream *)local_230;
  end_netstd_namespace(this,poVar2);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230,(int)poVar2);
  t_generator::indent_validate
            ((t_generator *)this,f_service_name.field_2._12_4_,"generate_service.");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_netstd_generator::generate_service(t_service* tservice)
{
    int ic = indent_count();

    string f_service_name = namespace_dir_ + "/" + service_name_ + ".cs";
    ofstream_with_content_based_conditional_update f_service;
    f_service.open(f_service_name.c_str());

    reset_indent();
    f_service << autogen_comment() << netstd_type_usings() << netstd_thrift_usings() << endl;

    start_netstd_namespace(f_service);

    f_service << indent() << "public partial class " << normalize_name(service_name_) << endl
              << indent() << "{" << endl;
    indent_up();

    generate_service_interface(f_service, tservice);
    generate_service_client(f_service, tservice);
    generate_service_server(f_service, tservice);
    generate_service_helpers(f_service, tservice);

    indent_down();
    f_service << indent() << "}" << endl;

    end_netstd_namespace(f_service);
    f_service.close();

    indent_validate(ic, "generate_service.");
}